

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O3

void __thiscall
duckdb::WindowSegmentTreePart::WindowSegmentValue
          (WindowSegmentTreePart *this,WindowSegmentTreeGlobalState *tree,idx_t l_idx,idx_t begin,
          idx_t end,data_ptr_t state_ptr)

{
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_00;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  ulong uVar4;
  pointer pWVar5;
  const_reference pvVar6;
  pointer this_01;
  ulong end_00;
  long lVar7;
  pointer puVar8;
  
  this_00 = &this->cursor;
  pWVar5 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator->(this_00);
  lVar7 = end - begin;
  if ((lVar7 != 0) &&
     ((pWVar5->chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pWVar5->chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    if (l_idx == 0) {
      if (begin < end) {
        do {
          pWVar5 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                   ::operator->(this_00);
          if (((pWVar5->state).next_row_index <= begin) ||
             (begin < (pWVar5->state).current_row_index)) {
            FlushStates(this,false);
            pWVar5 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                     ::operator->(this_00);
            if (((pWVar5->state).next_row_index <= begin) ||
               (begin < (pWVar5->state).current_row_index)) {
              this_01 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                        ::operator->(&pWVar5->paged->inputs);
              ColumnDataCollection::Seek(this_01,begin,&pWVar5->state,&pWVar5->chunk);
            }
          }
          pWVar5 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                   ::operator->(this_00);
          uVar4 = (pWVar5->state).next_row_index;
          end_00 = uVar4;
          if (end < uVar4) {
            end_00 = end;
          }
          ExtractFrame(this,begin,end_00,state_ptr);
          begin = end_00;
        } while (uVar4 < end);
      }
    }
    else {
      pvVar6 = vector<unsigned_long,_true>::operator[](&tree->levels_flat_start,l_idx - 1);
      pdVar1 = (this->statep).data;
      pdVar2 = (this->statel).data;
      puVar8 = (tree->levels_flat_native).states.
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start +
               (begin + *pvVar6) * (tree->levels_flat_native).state_size;
      do {
        iVar3 = this->flush_count;
        *(data_ptr_t *)(pdVar1 + iVar3 * 8) = state_ptr;
        this->flush_count = iVar3 + 1;
        *(pointer *)(pdVar2 + iVar3 * 8) = puVar8;
        puVar8 = puVar8 + this->state_size;
        if (0x7ff < iVar3 + 1) {
          FlushStates(this,true);
        }
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  return;
}

Assistant:

void WindowSegmentTreePart::WindowSegmentValue(const WindowSegmentTreeGlobalState &tree, idx_t l_idx, idx_t begin,
                                               idx_t end, data_ptr_t state_ptr) {
	D_ASSERT(begin <= end);
	auto &inputs = cursor->chunk;
	if (begin == end || inputs.ColumnCount() == 0) {
		return;
	}

	const auto count = end - begin;
	if (l_idx == 0) {
		//	Check the leaves when they cross chunk boundaries
		while (begin < end) {
			if (!cursor->RowIsVisible(begin)) {
				FlushStates(false);
				cursor->Seek(begin);
			}
			auto next = MinValue(end, cursor->state.next_row_index);
			ExtractFrame(begin, next, state_ptr);
			begin = next;
		}
	} else {
		// find out where the states begin
		auto begin_ptr = tree.levels_flat_native.GetStatePtr(begin + tree.levels_flat_start[l_idx - 1]);
		// set up a vector of pointers that point towards the set of states
		auto ldata = FlatVector::GetData<const_data_ptr_t>(statel);
		auto pdata = FlatVector::GetData<data_ptr_t>(statep);
		for (idx_t i = 0; i < count; i++) {
			pdata[flush_count] = state_ptr;
			ldata[flush_count++] = begin_ptr;
			begin_ptr += state_size;
			if (flush_count >= STANDARD_VECTOR_SIZE) {
				FlushStates(true);
			}
		}
	}
}